

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

NodeOutputData *
dxil_spv::Converter::Impl::get_node_output(NodeOutputData *__return_storage_ptr__,MDNode *output)

{
  uint uVar1;
  uint uVar2;
  MetadataKind MVar3;
  MDNode *node;
  LoggingCallback p_Var4;
  void *pvVar5;
  uint in_ECX;
  uint index;
  String local_1038 [128];
  
  (__return_storage_ptr__->node_id)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->node_id).field_2;
  (__return_storage_ptr__->node_id)._M_string_length = 0;
  index = 0;
  (__return_storage_ptr__->node_id).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->node_array_index = 0;
  __return_storage_ptr__->node_array_size = 0;
  __return_storage_ptr__->node_index_spec_constant_id = 0;
  __return_storage_ptr__->max_records = 0;
  __return_storage_ptr__->sparse_array = false;
  uVar1 = LLVMBC::MDNode::getNumOperands(output);
  if (uVar1 != 0) {
    do {
      uVar2 = get_constant_metadata<unsigned_int>(output,index);
      switch(uVar2) {
      case 0:
        node = (MDNode *)LLVMBC::MDNode::getOperand(output,index + 1);
        MVar3 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)node);
        if (MVar3 != Node) {
          p_Var4 = get_thread_log_callback();
          if (p_Var4 == (LoggingCallback)0x0) {
            get_node_output();
            std::terminate();
          }
          local_1038[0].field_2._M_allocated_capacity._0_5_ = 0x6163206e69;
          local_1038[0].field_2._5_1_ = 's';
          local_1038[0].field_2._6_1_ = 't';
          local_1038[0].field_2._7_1_ = '<';
          local_1038[0].field_2._8_1_ = 'T';
          local_1038[0].field_2._9_1_ = '>';
          local_1038[0].field_2._10_1_ = '.';
          local_1038[0].field_2._11_1_ = '\n';
          local_1038[0].field_2._12_1_ = '\0';
          local_1038[0]._M_dataplus._M_p = (pointer)0x2064696c61766e49;
          local_1038[0]._M_string_length._0_5_ = 0x2065707974;
          local_1038[0]._M_string_length._5_3_ = 0x204449;
          pvVar5 = get_thread_log_callback_userdata();
          (*p_Var4)(pvVar5,Error,(char *)local_1038);
          std::terminate();
        }
        get_string_metadata_abi_cxx11_(local_1038,(dxil_spv *)node,(MDNode *)0x0,in_ECX);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                  (&__return_storage_ptr__->node_id,local_1038);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
             *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
          free_in_thread(local_1038[0]._M_dataplus._M_p);
        }
        uVar2 = get_constant_metadata<unsigned_int>(node,1);
        __return_storage_ptr__->node_array_index = uVar2;
        break;
      case 3:
        uVar2 = get_constant_metadata<unsigned_int>(output,index + 1);
        __return_storage_ptr__->max_records = uVar2;
        break;
      case 5:
        uVar2 = get_constant_metadata<unsigned_int>(output,index + 1);
        __return_storage_ptr__->node_array_size = uVar2;
        break;
      case 6:
        uVar2 = get_constant_metadata<unsigned_int>(output,index + 1);
        __return_storage_ptr__->sparse_array = uVar2 != 0;
      }
      index = index + 2;
    } while (index < uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

NodeOutputData Converter::Impl::get_node_output(llvm::MDNode *output)
{
	NodeOutputData data = {};

	uint32_t num_ops = output->getNumOperands();
	for (uint32_t i = 0; i < num_ops; i += 2)
	{
		auto tag = DXIL::NodeMetadataTag(get_constant_metadata(output, i));
		if (tag == DXIL::NodeMetadataTag::NodeOutputID)
		{
			auto *output_node = llvm::cast<llvm::MDNode>(output->getOperand(i + 1));
			data.node_id = get_string_metadata(output_node, 0);
			data.node_array_index = get_constant_metadata(output_node, 1);
		}
		else if (tag == DXIL::NodeMetadataTag::NodeAllowSparseNodes)
			data.sparse_array = get_constant_metadata(output, i + 1) != 0;
		else if (tag == DXIL::NodeMetadataTag::NodeOutputArraySize)
			data.node_array_size = get_constant_metadata(output, i + 1);
		else if (tag == DXIL::NodeMetadataTag::NodeMaxRecords)
			data.max_records = get_constant_metadata(output, i + 1);
	}

	return data;
}